

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *J_00;
  AliasRet AVar3;
  
  uVar1 = J->chain[0x3b];
  if (lim < uVar1) {
    uVar2 = (J->fold).ins.field_0.op1;
    J_00 = (J->cur).ir;
    do {
      if (uVar2 == J_00[uVar1].field_0.op1) {
        return 0;
      }
      AVar3 = aa_table((jit_State *)&J_00->field_0,(uint)uVar2,(uint)J_00[uVar1].field_0.op1);
      if (AVar3 != ALIAS_NO) {
        return 0;
      }
      uVar1 = *(ushort *)((long)J_00 + (ulong)uVar1 * 8 + 6);
    } while ((ushort)lim < uVar1);
  }
  return 1;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}